

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_stack.hpp
# Opt level: O2

sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::xpressive::detail::
sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::push_sequence(sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *this,size_t count,
               sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *t)

{
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  
  psVar1 = this->curr_;
  if ((ulong)(((long)this->end_ - (long)psVar1) / 0x28) < count) {
    psVar1 = grow_(this,count,t);
    return psVar1;
  }
  this->curr_ = psVar1 + count;
  return psVar1;
}

Assistant:

T *push_sequence(std::size_t count, T const &t)
    {
        // Check to see if we have overflowed this buffer
        std::size_t size_left = static_cast< std::size_t >(this->end_ - this->curr_);
        if (size_left < count)
        {
            // allocate a new block and return a ptr to the new memory
            return this->grow_(count, t);
        }

        // This is the ptr to return
        T *ptr = this->curr_;

        // Advance the high-water mark
        this->curr_ += count;

        return ptr;
    }